

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_aa32_ld_i32(DisasContext_conflict1 *s,TCGv_i32 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar1;
  uintptr_t o;
  TCGv_i64 ret;
  TCGContext_conflict1 *tcg_ctx;
  MemOp memop;
  
  memop = opc | MO_ALIGN;
  if ((s->features >> 0x26 & 1) != 0) {
    memop = opc;
  }
  s_00 = s->uc->tcg_ctx;
  if (((uint)s->features >> 9 & 1) == 0) {
    memop = opc;
  }
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)s_00);
  tcg_gen_extu_i32_i64_aarch64(s_00,ret,a32);
  if ((((s->uc->mode & UC_MODE_ARMBE8) != UC_MODE_ARM) && (s->sctlr_b != 0)) &&
     ((memop & MO_64) < MO_32)) {
    tcg_gen_xori_i64_aarch64(s_00,ret,ret,(ulong)((-1 << (sbyte)(memop & MO_64)) + 4));
  }
  tcg_gen_qemu_ld_i32_aarch64(s_00,val,ret,(ulong)(uint)index,memop);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void gen_aa32_ld_i32(DisasContext *s, TCGv_i32 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr;

    if (arm_dc_feature(s, ARM_FEATURE_M) &&
        !arm_dc_feature(s, ARM_FEATURE_M_MAIN)) {
        opc |= MO_ALIGN;
    }

    addr = gen_aa32_addr(s, a32, opc);
    tcg_gen_qemu_ld_i32(tcg_ctx, val, addr, index, opc);
    tcg_temp_free(tcg_ctx, addr);
}